

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opnmidi_opn2.cpp
# Opt level: O0

OPNMIDI_VolumeModels __thiscall OPN2::getVolumeScaleModel(OPN2 *this)

{
  OPN2 *this_local;
  
  switch(this->m_volumeScale) {
  default:
    this_local._4_4_ = OPNMIDI_VolumeModel_Generic;
    break;
  case VOLUME_NATIVE:
    this_local._4_4_ = OPNMIDI_VolumeModel_NativeOPN2;
    break;
  case VOLUME_DMX:
    this_local._4_4_ = OPNMIDI_VolumeModel_DMX;
    break;
  case VOLUME_APOGEE:
    this_local._4_4_ = OPNMIDI_VolumeModel_APOGEE;
    break;
  case VOLUME_9X:
    this_local._4_4_ = OPNMIDI_VolumeModel_9X;
  }
  return this_local._4_4_;
}

Assistant:

OPNMIDI_VolumeModels OPN2::getVolumeScaleModel()
{
    switch(m_volumeScale)
    {
    default:
    case OPN2::VOLUME_Generic:
        return OPNMIDI_VolumeModel_Generic;
    case OPN2::VOLUME_NATIVE:
        return OPNMIDI_VolumeModel_NativeOPN2;
    case OPN2::VOLUME_DMX:
        return OPNMIDI_VolumeModel_DMX;
    case OPN2::VOLUME_APOGEE:
        return OPNMIDI_VolumeModel_APOGEE;
    case OPN2::VOLUME_9X:
        return OPNMIDI_VolumeModel_9X;
    }
}